

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

bool hashstring(char *str,char *result,int maxlen)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  int local_44;
  undefined1 local_40 [3];
  uchar c;
  int i;
  hashval hv;
  char *pcStack_20;
  int maxlen_local;
  char *result_local;
  char *str_local;
  
  if (maxlen < 0x31) {
    str_local._7_1_ = false;
  }
  else {
    hv.chunks[2]._4_4_ = maxlen;
    pcStack_20 = result;
    result_local = str;
    sVar2 = strlen(str);
    tiger::hash((uchar *)str,(int)sVar2,(hashval *)local_40);
    for (local_44 = 0; local_44 < 0x18; local_44 = local_44 + 1) {
      bVar1 = local_40[local_44];
      pcVar3 = pcStack_20 + 1;
      *pcStack_20 = "0123456789abcdef"[(int)(bVar1 & 0xf)];
      pcStack_20 = pcStack_20 + 2;
      *pcVar3 = "0123456789abcdef"[(int)(uint)bVar1 >> 4];
    }
    *pcStack_20 = '\0';
    str_local._7_1_ = true;
  }
  return str_local._7_1_;
}

Assistant:

bool hashstring(const char *str, char *result, int maxlen)
{
    tiger::hashval hv;
    if(maxlen < 2*(int)sizeof(hv.bytes) + 1) return false;
    tiger::hash((uchar *)str, strlen(str), hv);
    loopi(sizeof(hv.bytes))
    {
        uchar c = hv.bytes[i];
        *result++ = "0123456789abcdef"[c&0xF];
        *result++ = "0123456789abcdef"[c>>4];
    }
    *result = '\0';
    return true;
}